

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.h
# Opt level: O0

void __thiscall
MeCab::Allocator<mecab_node_t,_mecab_path_t>::~Allocator
          (Allocator<mecab_node_t,_mecab_path_t> *this)

{
  scoped_array<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::result_pair_type>
  *in_RDI;
  vector<char,_std::allocator<char>_> *unaff_retaddr;
  
  in_RDI->_vptr_scoped_array = (_func_int **)&PTR__Allocator_001c62f8;
  scoped_array<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::result_pair_type>
  ::~scoped_array(in_RDI);
  std::vector<char,_std::allocator<char>_>::~vector(unaff_retaddr);
  scoped_ptr<MeCab::NBestGenerator>::~scoped_ptr((scoped_ptr<MeCab::NBestGenerator> *)in_RDI);
  scoped_ptr<MeCab::ChunkFreeList<char>_>::~scoped_ptr
            ((scoped_ptr<MeCab::ChunkFreeList<char>_> *)in_RDI);
  scoped_ptr<MeCab::FreeList<mecab_path_t>_>::~scoped_ptr
            ((scoped_ptr<MeCab::FreeList<mecab_path_t>_> *)in_RDI);
  scoped_ptr<MeCab::FreeList<mecab_node_t>_>::~scoped_ptr
            ((scoped_ptr<MeCab::FreeList<mecab_node_t>_> *)in_RDI);
  return;
}

Assistant:

virtual ~Allocator() {}